

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void __thiscall ir_constant::copy_offset(ir_constant *this,ir_constant *src,int offset)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint64_t uVar6;
  int64_t iVar7;
  undefined4 extraout_var;
  float fVar8;
  double dVar9;
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  uint size;
  int offset_local;
  ir_constant *src_local;
  ir_constant *this_local;
  
  uVar3 = (uint)(byte)((this->super_ir_rvalue).type)->field_0x4;
  if ((uVar3 < 5) || (uVar3 - 9 < 5)) {
    uVar3 = glsl_type::components((src->super_ir_rvalue).type);
    uVar4 = glsl_type::components((this->super_ir_rvalue).type);
    if (uVar4 - offset < uVar3) {
      __assert_fail("size <= this->type->components() - offset",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir.cpp"
                    ,0x4d1,"void ir_constant::copy_offset(ir_constant *, int)");
    }
    for (local_24 = 0; local_24 < uVar3; local_24 = local_24 + 1) {
      switch(((this->super_ir_rvalue).type)->field_0x4) {
      case 0:
        uVar4 = get_uint_component(src,local_24);
        *(uint *)((long)&this->value + (ulong)(local_24 + offset) * 4) = uVar4;
        break;
      case 1:
        iVar5 = get_int_component(src,local_24);
        *(int *)((long)&this->value + (ulong)(local_24 + offset) * 4) = iVar5;
        break;
      case 2:
        fVar8 = get_float_component(src,local_24);
        *(float *)((long)&this->value + (ulong)(local_24 + offset) * 4) = fVar8;
        break;
      case 3:
        uVar2 = get_float16_component(src,local_24);
        *(uint16_t *)((long)&this->value + (ulong)(local_24 + offset) * 2) = uVar2;
        break;
      case 4:
        dVar9 = get_double_component(src,local_24);
        *(double *)((long)&this->value + (ulong)(local_24 + offset) * 8) = dVar9;
        break;
      default:
        break;
      case 9:
      case 0xc:
      case 0xd:
        uVar6 = get_uint64_component(src,local_24);
        *(uint64_t *)((long)&this->value + (ulong)(local_24 + offset) * 8) = uVar6;
        break;
      case 10:
        iVar7 = get_int64_component(src,local_24);
        *(int64_t *)((long)&this->value + (ulong)(local_24 + offset) * 8) = iVar7;
        break;
      case 0xb:
        bVar1 = get_bool_component(src,local_24);
        (this->value).b[local_24 + offset] = bVar1;
      }
    }
  }
  else {
    if ((uVar3 != 0xf) && (uVar3 != 0x11)) {
      __assert_fail("!\"Should not get here.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir.cpp"
                    ,0x4ff,"void ir_constant::copy_offset(ir_constant *, int)");
    }
    if ((src->super_ir_rvalue).type != (this->super_ir_rvalue).type) {
      __assert_fail("src->type == this->type",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ir.cpp"
                    ,0x4f7,"void ir_constant::copy_offset(ir_constant *, int)");
    }
    for (local_28 = 0; local_28 < ((this->super_ir_rvalue).type)->length; local_28 = local_28 + 1) {
      iVar5 = (*(src->const_elements[local_28]->super_ir_rvalue).super_ir_instruction.
                _vptr_ir_instruction[4])(src->const_elements[local_28],this,0);
      this->const_elements[local_28] = (ir_constant *)CONCAT44(extraout_var,iVar5);
    }
  }
  return;
}

Assistant:

void
ir_constant::copy_offset(ir_constant *src, int offset)
{
   switch (this->type->base_type) {
   case GLSL_TYPE_UINT:
   case GLSL_TYPE_INT:
   case GLSL_TYPE_FLOAT:
   case GLSL_TYPE_FLOAT16:
   case GLSL_TYPE_DOUBLE:
   case GLSL_TYPE_SAMPLER:
   case GLSL_TYPE_IMAGE:
   case GLSL_TYPE_UINT64:
   case GLSL_TYPE_INT64:
   case GLSL_TYPE_BOOL: {
      unsigned int size = src->type->components();
      assert (size <= this->type->components() - offset);
      for (unsigned int i=0; i<size; i++) {
	 switch (this->type->base_type) {
	 case GLSL_TYPE_UINT:
	    value.u[i+offset] = src->get_uint_component(i);
	    break;
	 case GLSL_TYPE_INT:
	    value.i[i+offset] = src->get_int_component(i);
	    break;
	 case GLSL_TYPE_FLOAT:
	    value.f[i+offset] = src->get_float_component(i);
	    break;
	 case GLSL_TYPE_FLOAT16:
	    value.f16[i+offset] = src->get_float16_component(i);
	    break;
	 case GLSL_TYPE_BOOL:
	    value.b[i+offset] = src->get_bool_component(i);
	    break;
	 case GLSL_TYPE_DOUBLE:
	    value.d[i+offset] = src->get_double_component(i);
	    break;
	 case GLSL_TYPE_SAMPLER:
	 case GLSL_TYPE_IMAGE:
	 case GLSL_TYPE_UINT64:
	    value.u64[i+offset] = src->get_uint64_component(i);
	    break;
	 case GLSL_TYPE_INT64:
	    value.i64[i+offset] = src->get_int64_component(i);
	    break;
	 default: // Shut up the compiler
	    break;
	 }
      }
      break;
   }

   case GLSL_TYPE_STRUCT:
   case GLSL_TYPE_ARRAY: {
      assert (src->type == this->type);
      for (unsigned i = 0; i < this->type->length; i++) {
	 this->const_elements[i] = src->const_elements[i]->clone(this, NULL);
      }
      break;
   }

   default:
      assert(!"Should not get here.");
      break;
   }
}